

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType sintType,TBasicType uintType)

{
  TBasicType uintType_local;
  TBasicType sintType_local;
  
  switch(sintType) {
  case EbtInt8:
    if ((((uintType != EbtUint8) && (uintType != EbtUint16)) && (uintType != EbtUint)) &&
       (uintType != EbtUint64)) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                    ,0x63f,
                    "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                   );
    }
    uintType_local._3_1_ = EbtVoid >> 0x18;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                  ,0x66a,
                  "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                 );
  case EbtInt16:
    switch(uintType) {
    case EbtUint8:
      uintType_local._3_1_ = 1;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                    ,0x64c,
                    "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                   );
    case EbtUint16:
    case EbtUint:
    case EbtUint64:
      uintType_local._3_1_ = EbtVoid >> 0x18;
    }
    break;
  case EbtInt:
    if ((uintType == EbtUint8) || (uintType == EbtUint16)) {
      uintType_local._3_1_ = 1;
    }
    else {
      if (uintType != EbtUint) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                      ,0x658,
                      "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                     );
      }
      uintType_local._3_1_ = EbtVoid >> 0x18;
    }
    break;
  case EbtInt64:
    switch(uintType) {
    case EbtUint8:
    case EbtUint16:
    case EbtUint:
      uintType_local._3_1_ = 1;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                    ,0x665,
                    "bool glslang::canSignedIntTypeRepresentAllUnsignedValues(TBasicType, TBasicType)"
                   );
    case EbtUint64:
      uintType_local._3_1_ = EbtVoid >> 0x18;
    }
  }
  return (bool)uintType_local._3_1_;
}

Assistant:

static bool canSignedIntTypeRepresentAllUnsignedValues(TBasicType sintType, TBasicType uintType)
{
    switch(sintType) {
    case EbtInt8:
        switch(uintType) {
        case EbtUint8:
        case EbtUint16:
        case EbtUint:
        case EbtUint64:
            return false;
        default:
            assert(false);
            return false;
        }
        break;
    case EbtInt16:
        switch(uintType) {
        case EbtUint8:
            return true;
        case EbtUint16:
        case EbtUint:
        case EbtUint64:
            return false;
        default:
            assert(false);
            return false;
        }
        break;
    case EbtInt:
        switch(uintType) {
        case EbtUint8:
        case EbtUint16:
            return true;
        case EbtUint:
            return false;
        default:
            assert(false);
            return false;
        }
        break;
    case EbtInt64:
        switch(uintType) {
        case EbtUint8:
        case EbtUint16:
        case EbtUint:
            return true;
        case EbtUint64:
            return false;
        default:
            assert(false);
            return false;
        }
        break;
    default:
        assert(false);
        return false;
    }
}